

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_postprocess.cpp
# Opt level: O2

void __thiscall FGLRenderer::PostProcessFXAA(FGLRenderer *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  FGLPostProcessState savedState;
  undefined8 local_40;
  FGLPostProcessState local_38;
  
  if (gl_postprocess.Value != 0) {
    uVar1 = this->mBuffers->mWidth;
    uVar2 = this->mBuffers->mHeight;
    local_40 = CONCAT44((float)(int)uVar2,(float)(int)uVar1);
    FGLPostProcessState::FGLPostProcessState(&local_38);
    FGLRenderBuffers::BindNextFB(this->mBuffers);
    FGLRenderBuffers::BindCurrentTexture(this->mBuffers,0);
    FFXAAShader::Bind(this->mFXAAShader);
    FBufferedUniform1i::Set(&this->mFXAAShader->InputTexture,0);
    FBufferedUniform2f::Set(&this->mFXAAShader->Resolution,(float *)&local_40);
    RenderScreenQuad(this);
    FGLRenderBuffers::NextTexture(this->mBuffers);
    FGLPostProcessState::~FGLPostProcessState(&local_38);
  }
  return;
}

Assistant:

void FGLRenderer::PostProcessFXAA()
{
	if (0 == gl_postprocess)
	{
		return;
	}

	const GLfloat resolution[2] =
	{
		static_cast<GLfloat>(mBuffers->GetWidth()),
		static_cast<GLfloat>(mBuffers->GetHeight())
	};

	FGLPostProcessState savedState;

	mBuffers->BindNextFB();
	mBuffers->BindCurrentTexture(0);
	mFXAAShader->Bind();
	mFXAAShader->InputTexture.Set(0);
	mFXAAShader->Resolution.Set(resolution);
	RenderScreenQuad();
	mBuffers->NextTexture();
}